

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIAggregator.cpp
# Opt level: O1

void __thiscall
adios2::aggregator::MPIAggregator::InitComm(MPIAggregator *this,size_t subStreams,Comm *parentComm)

{
  ulong uVar1;
  Comm *this_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  Comm CStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar8 = helper::Comm::Rank(parentComm);
  iVar9 = helper::Comm::Size(parentComm);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = subStreams;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)iVar9;
  uVar10 = SUB168(auVar5 / auVar2,0);
  uVar12 = (ulong)(long)iVar9 % subStreams;
  uVar11 = (ulong)(int)uVar8;
  uVar1 = uVar10 + 1;
  uVar13 = uVar12 * uVar1;
  if (uVar11 < uVar13) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar1;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar11;
    this->m_SubStreamIndex = SUB168(auVar6 / auVar3,0);
    iVar9 = SUB164(auVar6 / auVar3,0) * (int)uVar1;
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar10;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar11 - uVar13;
    this->m_SubStreamIndex = uVar12 + SUB168(auVar7 / auVar4,0);
    iVar9 = SUB164(auVar7 / auVar4,0) * SUB164(auVar5 / auVar2,0) + (int)uVar13;
  }
  this->m_AggregatorRank = iVar9;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"creating aggregators comm with split at Open","");
  helper::Comm::Split(&CStack_58,(int)parentComm,iVar9,(string *)(ulong)uVar8);
  this_00 = &this->m_Comm;
  helper::Comm::operator=(this_00,&CStack_58);
  helper::Comm::~Comm(&CStack_58);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  iVar9 = helper::Comm::Rank(this_00);
  this->m_Rank = iVar9;
  iVar9 = helper::Comm::Size(this_00);
  this->m_Size = iVar9;
  if (this->m_Rank != 0) {
    this->m_IsAggregator = false;
  }
  this->m_IsActive = true;
  this->m_SubStreams = subStreams;
  return;
}

Assistant:

void MPIAggregator::InitComm(const size_t subStreams, helper::Comm const &parentComm)
{
    int parentRank = parentComm.Rank();
    int parentSize = parentComm.Size();

    const size_t process = static_cast<size_t>(parentRank);
    const size_t processes = static_cast<size_t>(parentSize);

    // Divide the processes into S=subStreams groups.
    const size_t q = processes / subStreams;
    const size_t r = processes % subStreams;

    // Groups [0,r) have size q+1.  Groups [r,S) have size q.
    const size_t firstInSmallGroups = r * (q + 1);

    // Within each group the first process becomes its consumer.
    if (process >= firstInSmallGroups)
    {
        m_SubStreamIndex = r + (process - firstInSmallGroups) / q;
        m_AggregatorRank = static_cast<int>(firstInSmallGroups + (m_SubStreamIndex - r) * q);
    }
    else
    {
        m_SubStreamIndex = process / (q + 1);
        m_AggregatorRank = static_cast<int>(m_SubStreamIndex * (q + 1));
    }

    m_Comm = parentComm.Split(m_AggregatorRank, parentRank,
                              "creating aggregators comm with split at Open");

    m_Rank = m_Comm.Rank();
    m_Size = m_Comm.Size();

    if (m_Rank != 0)
    {
        m_IsAggregator = false;
    }

    m_IsActive = true;
    m_SubStreams = subStreams;
}